

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O3

bool __thiscall DIntermissionController::NextPage(DIntermissionController *this)

{
  uint uVar1;
  FIntermissionAction *pFVar2;
  PClass *this_00;
  Node *pNVar3;
  DIntermissionScreen *pDVar4;
  uint uVar5;
  Node *pNVar6;
  bool bVar7;
  FIntermissionAction **ppFVar8;
  int unaff_R12D;
  FIntermissionDescriptor *pFVar9;
  
  uVar5 = this->mIndex;
  pFVar9 = this->mDesc;
  if ((uVar5 == (pFVar9->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count)
     && ((pFVar9->mLink).Index == 0)) {
    return false;
  }
  pDVar4 = (this->mScreen).field_0.p;
  if (pDVar4 != (DIntermissionScreen *)0x0) {
    if (((pDVar4->super_DObject).ObjectFlags & 0x20) == 0) {
      bVar7 = pDVar4->mFlatfill;
      unaff_R12D = (pDVar4->mBackground).texnum;
      (*(pDVar4->super_DObject)._vptr_DObject[4])();
      pFVar9 = this->mDesc;
      uVar5 = this->mIndex;
      goto LAB_00303978;
    }
    (this->mScreen).field_0.p = (DIntermissionScreen *)0x0;
  }
  bVar7 = false;
LAB_00303978:
  do {
    uVar1 = (pFVar9->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count;
    if (uVar5 < uVar1) {
      ppFVar8 = (pFVar9->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array
                + (int)uVar5;
      do {
        pFVar2 = *ppFVar8;
        this_00 = pFVar2->mClass;
        if (this_00 != (PClass *)0xffffffffffffffff) {
          if (this_00 == (PClass *)0xfffffffffffffffe) {
            this->mIndex = uVar5 + 1;
            (*(this->super_DObject)._vptr_DObject[4])(this);
            D_StartTitle();
            return false;
          }
          this->mIndex = uVar5 + 1;
          pDVar4 = (DIntermissionScreen *)PClass::CreateNew(this_00);
          (this->mScreen).field_0.p = pDVar4;
          (pDVar4->mBackground).texnum = unaff_R12D;
          pDVar4->mFlatfill = bVar7;
          (*(pDVar4->super_DObject)._vptr_DObject[7])(pDVar4,pFVar2,(ulong)this->mFirst);
          this->mFirst = false;
          return true;
        }
        wipegamestate = *(gamestate_t *)&pFVar2[1]._vptr_FIntermissionAction;
        ppFVar8 = ppFVar8 + 1;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar1);
      this->mIndex = uVar5;
    }
    uVar5 = (pFVar9->mLink).Index;
    if (uVar5 == 0) {
      return false;
    }
    pNVar3 = IntermissionDescriptors.Nodes + (IntermissionDescriptors.Size - 1 & uVar5);
    do {
      pNVar6 = pNVar3;
      if (pNVar6 == (Node *)0x0) {
        return false;
      }
      if (pNVar6->Next == (Node *)0x1) {
        return false;
      }
      pNVar3 = pNVar6->Next;
    } while ((pNVar6->Pair).Key.Index != uVar5);
    if (this->mDeleteDesc == true) {
      TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*>::~TDeletingArray
                (&pFVar9->mActions);
      operator_delete(pFVar9,0x18);
    }
    this->mDeleteDesc = false;
    this->mIndex = 0;
    pFVar9 = (pNVar6->Pair).Value;
    this->mDesc = pFVar9;
    uVar5 = 0;
  } while( true );
}

Assistant:

bool DIntermissionController::NextPage ()
{
	FTextureID bg;
	bool fill = false;

	if (mIndex == (int)mDesc->mActions.Size() && mDesc->mLink == NAME_None)
	{
		// last page
		return false;
	}

	if (mScreen != NULL)
	{
		bg = mScreen->GetBackground(&fill);
		mScreen->Destroy();
	}
again:
	while ((unsigned)mIndex < mDesc->mActions.Size())
	{
		FIntermissionAction *action = mDesc->mActions[mIndex++];
		if (action->mClass == WIPER_ID)
		{
			wipegamestate = static_cast<FIntermissionActionWiper*>(action)->mWipeType;
		}
		else if (action->mClass == TITLE_ID)
		{
			Destroy();
			D_StartTitle ();
			return false;
		}
		else
		{
			// create page here
			mScreen = (DIntermissionScreen*)action->mClass->CreateNew();
			mScreen->SetBackground(bg, fill);	// copy last screen's background before initializing
			mScreen->Init(action, mFirst);
			mFirst = false;
			return true;
		}
	}
	if (mDesc->mLink != NAME_None)
	{
		FIntermissionDescriptor **pDesc = IntermissionDescriptors.CheckKey(mDesc->mLink);
		if (pDesc != NULL)
		{
			if (mDeleteDesc) delete mDesc;
			mDeleteDesc = false;
			mIndex = 0;
			mDesc = *pDesc;
			goto again;
		}
	}
	return false;
}